

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O2

int32_t benchmark::Int32FromEnv(char *flag,int32_t default_value)

{
  bool bVar1;
  char *str;
  ostream *poVar2;
  char *in_RDX;
  int32_t iVar3;
  int32_t result;
  string env_var;
  allocator local_7d;
  int32_t local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  FlagToEnvVar_abi_cxx11_(&local_38,(benchmark *)flag,in_RDX);
  str = getenv(local_38._M_dataplus._M_p);
  iVar3 = default_value;
  if (str != (char *)0x0) {
    local_7c = default_value;
    std::__cxx11::string::string((string *)&local_78,"Environment variable ",&local_7d);
    std::operator+(&local_58,&local_78,&local_38);
    bVar1 = ParseInt32(&local_58,str,&local_7c);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    iVar3 = local_7c;
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"The default value ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,default_value);
      std::operator<<(poVar2," is used.\n");
      iVar3 = default_value;
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return iVar3;
}

Assistant:

int32_t Int32FromEnv(const char* flag, int32_t default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = GetEnv(env_var.c_str());
  if (string_value == nullptr) {
    // The environment variable is not set.
    return default_value;
  }

  int32_t result = default_value;
  if (!ParseInt32(std::string("Environment variable ") + env_var, string_value,
                  &result)) {
    std::cout << "The default value " << default_value << " is used.\n";
    return default_value;
  }

  return result;
}